

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChElementBeamANCF_3333.h
# Opt level: O2

void __thiscall chrono::fea::ChElementBeamANCF_3333::GetSubBlockOffset(ChElementBeamANCF_3333 *this)

{
  return;
}

Assistant:

virtual unsigned int GetSubBlockOffset(int nblock) override { return m_nodes[nblock]->NodeGetOffset_w(); }